

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall
cmFileAPI::BuildClientReplyResponses
          (Value *__return_storage_ptr__,cmFileAPI *this,ClientRequests *requests)

{
  pointer pCVar1;
  pointer request;
  Value local_50;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  if ((requests->Error)._M_string_length == 0) {
    Json::Value::Value(&local_50,arrayValue);
    Json::Value::operator=(__return_storage_ptr__,&local_50);
    Json::Value::~Value(&local_50);
    pCVar1 = (requests->
             super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>).
             super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (request = (requests->
                   super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                   ).
                   super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>
                   ._M_impl.super__Vector_impl_data._M_start; request != pCVar1;
        request = request + 1) {
      BuildClientReplyResponse(&local_50,this,request);
      Json::Value::append(__return_storage_ptr__,&local_50);
      Json::Value::~Value(&local_50);
    }
  }
  else {
    BuildReplyError(&local_50,&requests->Error);
    Json::Value::operator=(__return_storage_ptr__,&local_50);
    Json::Value::~Value(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReplyResponses(
  ClientRequests const& requests)
{
  Json::Value responses;

  if (!requests.Error.empty()) {
    responses = this->BuildReplyError(requests.Error);
    return responses;
  }

  responses = Json::arrayValue;
  for (ClientRequest const& request : requests) {
    responses.append(this->BuildClientReplyResponse(request));
  }

  return responses;
}